

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O3

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Get(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *root,size_t *unresolvedTokenIndex)

{
  uint uVar1;
  size_t sVar2;
  Token *pTVar3;
  ushort uVar4;
  Token *pTVar5;
  long lVar6;
  MemberIterator m;
  undefined8 local_38;
  
  sVar2 = this->tokenCount_;
  if (sVar2 != 0) {
    pTVar3 = this->tokens_;
    lVar6 = -(long)pTVar3;
    pTVar5 = pTVar3;
    do {
      uVar4 = (root->data_).f.flags & 7;
      if (uVar4 == 4) {
        uVar1 = pTVar5->index;
        if (((ulong)uVar1 == 0xffffffff) || ((root->data_).s.length <= uVar1)) {
LAB_001073d9:
          if (unresolvedTokenIndex != (size_t *)0x0) {
            *unresolvedTokenIndex = -((long)&this->tokens_->name + lVar6) >> 4;
          }
          return (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)0x0;
        }
        root = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((ulong)uVar1 * 0x10 + ((ulong)(root->data_).s.str & 0xffffffffffff));
      }
      else {
        if ((uVar4 != 3) ||
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&stack0xffffffffffffffc8,(Ch *)root),
           local_38 ==
           (ulong)(root->data_).s.length * 0x20 + ((ulong)(root->data_).s.str & 0xffffffffffff)))
        goto LAB_001073d9;
        root = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)(local_38 + 0x10);
        pTVar3 = this->tokens_;
        sVar2 = this->tokenCount_;
      }
      pTVar5 = pTVar5 + 1;
      lVar6 = lVar6 + -0x10;
    } while (pTVar5 != pTVar3 + sVar2);
  }
  return root;
}

Assistant:

ValueType* Get(ValueType& root, size_t* unresolvedTokenIndex = 0) const {
        RAPIDJSON_ASSERT(IsValid());
        ValueType* v = &root;
        for (const Token *t = tokens_; t != tokens_ + tokenCount_; ++t) {
            switch (v->GetType()) {
            case kObjectType:
                {
                    typename ValueType::MemberIterator m = v->FindMember(GenericStringRef<Ch>(t->name, t->length));
                    if (m == v->MemberEnd())
                        break;
                    v = &m->value;
                }
                continue;
            case kArrayType:
                if (t->index == kPointerInvalidIndex || t->index >= v->Size())
                    break;
                v = &((*v)[t->index]);
                continue;
            default:
                break;
            }

            // Error: unresolved token
            if (unresolvedTokenIndex)
                *unresolvedTokenIndex = static_cast<size_t>(t - tokens_);
            return 0;
        }
        return v;
    }